

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

tlc_linecount_t
TURBOLINECOUNT::CLineCount::LineCount
          (tlc_filehandle_t fhandle,tlc_error_t *error,tlc_string_t *errorstring)

{
  bool bVar1;
  int iVar2;
  tlc_linecount_t tVar3;
  tlc_linecount_t count;
  CLineCount lc;
  tlc_linecount_t local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  CLineCount local_b0;
  
  CLineCount(&local_b0,(PARAMETERS *)0x0);
  iVar2 = open(&local_b0,fhandle,0);
  if ((char)iVar2 == '\0') {
    if (error != (tlc_error_t *)0x0) {
      *error = local_b0.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_00103460;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_b0.m_lasterrorstring._M_dataplus._M_p,
               local_b0.m_lasterrorstring._M_dataplus._M_p +
               local_b0.m_lasterrorstring._M_string_length);
  }
  else {
    bVar1 = countLines(&local_b0,&local_d8);
    if (bVar1) {
      *error = 0;
      std::__cxx11::string::_M_replace
                ((ulong)errorstring,0,(char *)errorstring->_M_string_length,0x1040c8);
      tVar3 = local_d8;
      goto LAB_00103460;
    }
    if (error != (tlc_error_t *)0x0) {
      *error = local_b0.m_lasterror;
    }
    tVar3 = -1;
    if (errorstring == (tlc_string_t *)0x0) goto LAB_00103460;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_b0.m_lasterrorstring._M_dataplus._M_p,
               local_b0.m_lasterrorstring._M_dataplus._M_p +
               local_b0.m_lasterrorstring._M_string_length);
  }
  tVar3 = -1;
  std::__cxx11::string::operator=((string *)errorstring,(string *)local_d0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
LAB_00103460:
  ~CLineCount(&local_b0);
  return tVar3;
}

Assistant:

tlc_linecount_t CLineCount::LineCount(tlc_filehandle_t fhandle, tlc_error_t * error, tlc_string_t *errorstring)
{
	CLineCount lc;
	if (!lc.open(fhandle))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}

		return -1;
	}

	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		if (error)
		{
			*error = lc.lastError();
		}
		if (errorstring)
		{
			*errorstring = lc.lastErrorString();
		}
		return -1;
	}

	*error = 0;
	*errorstring = _T("");

	return count;
}